

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O0

void __thiscall
tchecker::details::
statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>::
compile_while(statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
              *this,typed_expression_t *cond,typed_statement_t *stmt)

{
  size_type sVar1;
  long local_c0;
  value_type_conflict2 local_b8;
  vector<long,_std::allocator<long>_> local_b0;
  long local_98;
  value_type_conflict2 local_90;
  vector<long,_std::allocator<long>_> local_88;
  size_type local_70;
  size_type stmt_len;
  vector<long,_std::allocator<long>_> stmt_bytecode;
  size_type cond_len;
  vector<long,_std::allocator<long>_> cond_bytecode;
  typed_statement_t *stmt_local;
  typed_expression_t *cond_local;
  statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  *this_local;
  
  cond_bytecode.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)stmt;
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)&cond_len)
  ;
  sVar1 = compile_tmp_rvalue_expression(cond,(vector<long,_std::allocator<long>_> *)&cond_len);
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)&stmt_len)
  ;
  local_70 = compile_tmp_statement
                       ((typed_statement_t *)
                        cond_bytecode.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                        (vector<long,_std::allocator<long>_> *)&stmt_len);
  std::vector<long,_std::allocator<long>_>::vector
            (&local_88,(vector<long,_std::allocator<long>_> *)&cond_len);
  append_bytecode<std::back_insert_iterator<std::vector<long,std::allocator<long>>>>
            (&this->_bytecode_back_inserter,&local_88);
  std::vector<long,_std::allocator<long>_>::~vector(&local_88);
  local_90 = 4;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (&this->_bytecode_back_inserter,&local_90);
  local_98 = local_70 + 2;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (&this->_bytecode_back_inserter,&local_98);
  std::vector<long,_std::allocator<long>_>::vector
            (&local_b0,(vector<long,_std::allocator<long>_> *)&stmt_len);
  append_bytecode<std::back_insert_iterator<std::vector<long,std::allocator<long>>>>
            (&this->_bytecode_back_inserter,&local_b0);
  std::vector<long,_std::allocator<long>_>::~vector(&local_b0);
  local_b8 = 3;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (&this->_bytecode_back_inserter,&local_b8);
  local_c0 = -4 - (sVar1 + local_70);
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (&this->_bytecode_back_inserter,&local_c0);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)&stmt_len);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)&cond_len);
  return;
}

Assistant:

void compile_while(tchecker::typed_expression_t const & cond, tchecker::typed_statement_t const & stmt)
  {
    // pre-compute cond and stmt bytecodes to get their respective lengths

    std::vector<tchecker::bytecode_t> cond_bytecode;
    auto cond_len = compile_tmp_rvalue_expression(cond, cond_bytecode);

    std::vector<tchecker::bytecode_t> stmt_bytecode;
    auto stmt_len = compile_tmp_statement(stmt, stmt_bytecode);

    // generation of while bytecode
    //  - insert 'cond' bytecode
    append_bytecode(_bytecode_back_inserter, cond_bytecode);

    //  - insert a conditional jump over 'stmt' bytecode and loop instruction
    _bytecode_back_inserter = tchecker::VM_JMPZ;
    _bytecode_back_inserter = stmt_len + 2;

    //  - insert bytecode for the 'stmt' statement
    append_bytecode(_bytecode_back_inserter, stmt_bytecode);

    //  - insert a loop back to 'cond' bytecode
    _bytecode_back_inserter = tchecker::VM_JMP;
    _bytecode_back_inserter = -(cond_len + 2 + stmt_len + 2);
  }